

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O1

string * __thiscall
OpenMPProcBindClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPProcBindClause *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string parameter_string;
  long *local_68 [2];
  long local_58 [2];
  undefined1 *local_48;
  long local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"proc_bind (","")
  ;
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  if ((ulong)this->proc_bind_kind < 3) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_48,0,(char *)0x0,
               (ulong)(&DAT_001a9378 + *(int *)(&DAT_001a9378 + (ulong)this->proc_bind_kind * 4)));
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The parameter of proc_bind clause is not supported.\n",0x34);
  }
  if (local_40 == 0) {
    std::__cxx11::string::substr((ulong)local_68,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_68);
    if (local_68[0] == local_58) goto LAB_0017fd02;
  }
  else {
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>((string *)local_68,local_48,local_48 + local_40);
    std::__cxx11::string::append((char *)local_68);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68[0]);
    if (local_68[0] == local_58) goto LAB_0017fd02;
  }
  operator_delete(local_68[0],local_58[0] + 1);
LAB_0017fd02:
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPProcBindClause::toString() {

    std::string result = "proc_bind (";
    std::string parameter_string;
    OpenMPProcBindClauseKind proc_bind_kind = this->getProcBindClauseKind();
    switch (proc_bind_kind) {
        case OMPC_PROC_BIND_close:
            parameter_string = "close";
            break;
        case OMPC_PROC_BIND_master:
            parameter_string = "master";
            break;
        case OMPC_PROC_BIND_spread:
            parameter_string = "spread";
            break;
        default:
            std::cout << "The parameter of proc_bind clause is not supported.\n";
    };

    if (parameter_string.size() > 0) {
        result += parameter_string + ") ";
    }
    else {
        result = result.substr(0, result.size()-2);
    }

    return result;
}